

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O1

Box * __thiscall
amrex::BATbndryReg::operator()(Box *__return_storage_ptr__,BATbndryReg *this,Box *a_bx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong local_30;
  uint local_28;
  ulong local_20;
  uint local_18;
  
  uVar3 = *(ulong *)(a_bx->smallend).vect;
  uVar10 = uVar3 >> 0x20;
  local_18 = (a_bx->smallend).vect[2];
  iVar6 = (this->m_crse_ratio).vect[0];
  iVar8 = (int)uVar3;
  if (iVar6 == 1) {
    uVar12 = uVar3 & 0xffffffff;
  }
  else if (iVar6 == 4) {
    if (iVar8 < 0) {
      uVar5 = iVar8 + 1;
      uVar7 = -uVar5;
      if (0 < (int)uVar5) {
        uVar7 = uVar5;
      }
      uVar7 = uVar7 >> 2;
      goto LAB_0018562f;
    }
    uVar12 = uVar3 >> 2 & 0x3fffffff;
  }
  else if (iVar6 == 2) {
    if (iVar8 < 0) {
      uVar5 = iVar8 + 1;
      uVar7 = -uVar5;
      if (0 < (int)uVar5) {
        uVar7 = uVar5;
      }
      uVar7 = uVar7 >> 1;
LAB_0018562f:
      uVar12 = (ulong)~uVar7;
    }
    else {
      uVar12 = uVar3 >> 1 & 0x7fffffff;
    }
  }
  else {
    if (iVar8 < 0) {
      iVar8 = iVar8 + 1;
      iVar4 = -iVar8;
      if (0 < iVar8) {
        iVar4 = iVar8;
      }
      uVar7 = iVar4 / iVar6;
      goto LAB_0018562f;
    }
    uVar12 = (long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / (long)iVar6 &
             0xffffffff;
  }
  iVar8 = (this->m_crse_ratio).vect[1];
  if (iVar8 != 1) {
    uVar7 = (uint)(uVar3 >> 0x20);
    if (iVar8 == 4) {
      if ((long)uVar3 < 0) {
        uVar7 = uVar7 + 1;
        uVar5 = -uVar7;
        if (0 < (int)uVar7) {
          uVar5 = uVar7;
        }
        uVar5 = uVar5 >> 2;
LAB_00185685:
        uVar5 = ~uVar5;
LAB_00185687:
        uVar10 = (ulong)uVar5;
      }
      else {
        uVar10 = (ulong)(uVar7 >> 2);
      }
    }
    else if (iVar8 == 2) {
      if ((long)uVar3 < 0) {
        uVar7 = uVar7 + 1;
        uVar5 = -uVar7;
        if (0 < (int)uVar7) {
          uVar5 = uVar7;
        }
        uVar5 = uVar5 >> 1;
        goto LAB_00185685;
      }
      uVar10 = (ulong)(uVar7 >> 1);
    }
    else {
      if (-1 < (long)uVar3) {
        uVar5 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar10) / (long)iVar8);
        goto LAB_00185687;
      }
      iVar9 = uVar7 + 1;
      iVar4 = -iVar9;
      if (0 < iVar9) {
        iVar4 = iVar9;
      }
      uVar10 = (ulong)(uint)~(iVar4 / iVar8);
    }
  }
  iVar4 = (this->m_crse_ratio).vect[2];
  if (iVar4 != 1) {
    if (iVar4 == 4) {
      if ((int)local_18 < 0) {
        local_18 = local_18 + 1;
        uVar7 = -local_18;
        if (0 < (int)local_18) {
          uVar7 = local_18;
        }
        uVar7 = uVar7 >> 2;
LAB_001856f9:
        local_18 = ~uVar7;
      }
      else {
        local_18 = local_18 >> 2;
      }
    }
    else if (iVar4 == 2) {
      if ((int)local_18 < 0) {
        local_18 = local_18 + 1;
        uVar7 = -local_18;
        if (0 < (int)local_18) {
          uVar7 = local_18;
        }
        uVar7 = uVar7 >> 1;
        goto LAB_001856f9;
      }
      local_18 = local_18 >> 1;
    }
    else if ((int)local_18 < 0) {
      iVar11 = local_18 + 1;
      iVar9 = -iVar11;
      if (0 < iVar11) {
        iVar9 = iVar11;
      }
      local_18 = ~(iVar9 / iVar4);
    }
    else {
      local_18 = (int)local_18 / iVar4;
    }
  }
  local_20 = uVar12 | uVar10 << 0x20;
  uVar3 = *(ulong *)(a_bx->bigend).vect;
  uVar10 = uVar3 >> 0x20;
  local_28 = (a_bx->bigend).vect[2];
  iVar9 = (int)uVar3;
  if (iVar6 == 1) {
    uVar12 = uVar3 & 0xffffffff;
  }
  else if (iVar6 == 4) {
    if (iVar9 < 0) {
      uVar5 = iVar9 + 1;
      uVar7 = -uVar5;
      if (0 < (int)uVar5) {
        uVar7 = uVar5;
      }
      uVar7 = uVar7 >> 2;
      goto LAB_001857af;
    }
    uVar12 = uVar3 >> 2 & 0x3fffffff;
  }
  else if (iVar6 == 2) {
    if (iVar9 < 0) {
      uVar5 = iVar9 + 1;
      uVar7 = -uVar5;
      if (0 < (int)uVar5) {
        uVar7 = uVar5;
      }
      uVar7 = uVar7 >> 1;
LAB_001857af:
      uVar12 = (ulong)~uVar7;
    }
    else {
      uVar12 = uVar3 >> 1 & 0x7fffffff;
    }
  }
  else {
    if (iVar9 < 0) {
      iVar9 = iVar9 + 1;
      iVar11 = -iVar9;
      if (0 < iVar9) {
        iVar11 = iVar9;
      }
      uVar7 = iVar11 / iVar6;
      goto LAB_001857af;
    }
    uVar12 = (long)((ulong)(uint)(iVar9 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / (long)iVar6 &
             0xffffffff;
  }
  if (iVar8 != 1) {
    uVar7 = (uint)(uVar3 >> 0x20);
    if (iVar8 == 4) {
      if ((long)uVar3 < 0) {
        uVar7 = uVar7 + 1;
        uVar5 = -uVar7;
        if (0 < (int)uVar7) {
          uVar5 = uVar7;
        }
        uVar5 = uVar5 >> 2;
LAB_00185802:
        uVar5 = ~uVar5;
LAB_00185804:
        uVar10 = (ulong)uVar5;
      }
      else {
        uVar10 = (ulong)(uVar7 >> 2);
      }
    }
    else if (iVar8 == 2) {
      if ((long)uVar3 < 0) {
        uVar7 = uVar7 + 1;
        uVar5 = -uVar7;
        if (0 < (int)uVar7) {
          uVar5 = uVar7;
        }
        uVar5 = uVar5 >> 1;
        goto LAB_00185802;
      }
      uVar10 = (ulong)(uVar7 >> 1);
    }
    else {
      if (-1 < (long)uVar3) {
        uVar5 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar10) / (long)iVar8);
        goto LAB_00185804;
      }
      iVar9 = uVar7 + 1;
      iVar6 = -iVar9;
      if (0 < iVar9) {
        iVar6 = iVar9;
      }
      uVar10 = (ulong)(uint)~(iVar6 / iVar8);
    }
  }
  if (iVar4 == 1) goto LAB_0018587d;
  if (iVar4 == 4) {
    if (-1 < (int)local_28) {
      local_28 = local_28 >> 2;
      goto LAB_0018587d;
    }
    local_28 = local_28 + 1;
    uVar7 = -local_28;
    if (0 < (int)local_28) {
      uVar7 = local_28;
    }
    uVar7 = uVar7 >> 2;
  }
  else {
    if (iVar4 != 2) {
      if ((int)local_28 < 0) {
        iVar8 = local_28 + 1;
        iVar6 = -iVar8;
        if (0 < iVar8) {
          iVar6 = iVar8;
        }
        local_28 = ~(iVar6 / iVar4);
      }
      else {
        local_28 = (int)local_28 / iVar4;
      }
      goto LAB_0018587d;
    }
    if (-1 < (int)local_28) {
      local_28 = local_28 >> 1;
      goto LAB_0018587d;
    }
    local_28 = local_28 + 1;
    uVar7 = -local_28;
    if (0 < (int)local_28) {
      uVar7 = local_28;
    }
    uVar7 = uVar7 >> 1;
  }
  local_28 = ~uVar7;
LAB_0018587d:
  local_30 = uVar12 | uVar10 << 0x20;
  iVar6 = (this->m_face).val;
  uVar7 = iVar6 % 3;
  if (iVar6 < 3) {
    *(undefined4 *)((long)&local_30 + (long)(int)uVar7 * 4) =
         *(undefined4 *)((long)&local_20 + (long)(int)uVar7 * 4);
  }
  else {
    *(undefined4 *)((long)&local_20 + (ulong)uVar7 * 4) =
         *(undefined4 *)((long)&local_30 + (ulong)uVar7 * 4);
  }
  uVar1 = *(undefined8 *)(this->m_loshft).vect;
  uVar2 = *(undefined8 *)(this->m_hishft).vect;
  iVar6 = (this->m_hishft).vect[2];
  uVar7 = (this->m_typ).itype;
  (__return_storage_ptr__->smallend).vect[2] = local_18 + (this->m_loshft).vect[2];
  *(ulong *)(__return_storage_ptr__->smallend).vect =
       CONCAT44((int)(local_20 >> 0x20) + (int)((ulong)uVar1 >> 0x20),(int)local_20 + (int)uVar1);
  *(ulong *)(__return_storage_ptr__->bigend).vect =
       CONCAT44((int)(local_30 >> 0x20) + (int)((ulong)uVar2 >> 0x20),(int)local_30 + (int)uVar2);
  (__return_storage_ptr__->bigend).vect[2] = local_28 + iVar6;
  (__return_storage_ptr__->btype).itype = uVar7;
  return __return_storage_ptr__;
}

Assistant:

Box operator() (const Box& a_bx) const noexcept {
        IntVect lo = amrex::coarsen(a_bx.smallEnd(), m_crse_ratio);
        IntVect hi = amrex::coarsen(a_bx.bigEnd(), m_crse_ratio);
        const int d = m_face.coordDir();
        if (m_face.isLow()) {
            hi[d] = lo[d];
        } else {
            lo[d] = hi[d];
        }
        lo += m_loshft;
        hi += m_hishft;
        return Box(lo,hi,m_typ);
    }